

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O2

void __thiscall
pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::maybe(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        *this,maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  this->valid_ = false;
  if (other->valid_ == true) {
    pbVar1 = operator->(other);
    std::__cxx11::string::string((string *)&(this->storage_).__align,(string *)pbVar1);
    this->valid_ = true;
  }
  return;
}

Assistant:

maybe (maybe && other) noexcept (std::is_nothrow_move_constructible<T>::value) {
            if (other.valid_) {
                new (&storage_) T (std::move (*other));
                valid_ = true;
            }
        }